

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_cstring.hpp
# Opt level: O3

void __thiscall
boost::unit_test::framework::impl::name_filter::component::component
          (component *this,const_string *name)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  
  (this->m_name).m_begin = "";
  (this->m_name).m_end = "";
  pcVar1 = name->m_begin;
  pcVar2 = name->m_end;
  lVar3 = (long)pcVar2 - (long)pcVar1;
  if ((lVar3 == 1) && (*pcVar1 == '*')) {
    this->m_kind = SFK_ALL;
    return;
  }
  if (pcVar2 == pcVar1) {
LAB_00184605:
    this->m_kind = SFK_MATCH;
  }
  else if (*pcVar1 == '*') {
    if (pcVar2[-1] != '*') {
      this->m_kind = SFK_TRAILING;
      if (lVar3 == -1) {
        pcVar2 = pcVar1 + -1;
      }
      (this->m_name).m_begin = pcVar1 + 1;
      goto LAB_0018460f;
    }
    this->m_kind = SFK_SUBSTR;
    pcVar2 = pcVar1 + lVar3 + -1;
    pcVar1 = pcVar1 + 1;
  }
  else {
    if (pcVar2[-1] != '*') goto LAB_00184605;
    this->m_kind = SFK_LEADING;
    pcVar2 = pcVar1 + lVar3 + -1;
  }
  (this->m_name).m_begin = pcVar1;
LAB_0018460f:
  (this->m_name).m_end = pcVar2;
  return;
}

Assistant:

inline
basic_cstring<CharT>::basic_cstring()
: m_begin( null_str() )
, m_end( m_begin )
{
}